

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementText.cpp
# Opt level: O0

void __thiscall
Rml::ElementText::GenerateGeometry
          (ElementText *this,RenderManager *render_manager,FontFaceHandle font_face_handle)

{
  FontEffectsHandle FVar1;
  StableVectorIndex SVar2;
  undefined8 uVar3;
  ulong uVar4;
  pointer pCVar5;
  int iVar6;
  ComputedValues *this_00;
  size_type sVar7;
  pointer pCVar8;
  reference pvVar9;
  reference pvVar10;
  FontEngineInterface *pFVar11;
  reference pvVar12;
  pointer pGVar13;
  undefined1 local_e8 [24];
  size_t i_2;
  Vector2f local_c8;
  StringView local_c0;
  ulong local_b0;
  size_t i_1;
  pointer local_78;
  size_t i;
  allocator<Rml::TexturedMesh> local_59;
  undefined1 local_58 [8];
  TexturedMeshList mesh_list;
  TextShapingContext text_shaping_context;
  ComputedValues *computed;
  FontFaceHandle font_face_handle_local;
  RenderManager *render_manager_local;
  ElementText *this_local;
  
  this_00 = Element::GetComputedValues(&this->super_Element);
  mesh_list.super__Vector_base<Rml::TexturedMesh,_std::allocator<Rml::TexturedMesh>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)Style::ComputedValues::language_abi_cxx11_(this_00);
  Style::ComputedValues::direction(this_00);
  Style::ComputedValues::letter_spacing(this_00);
  sVar7 = ::std::
          vector<Rml::ElementText::TexturedGeometry,_std::allocator<Rml::ElementText::TexturedGeometry>_>
          ::size(&this->geometry);
  ::std::allocator<Rml::TexturedMesh>::allocator(&local_59);
  ::std::vector<Rml::TexturedMesh,_std::allocator<Rml::TexturedMesh>_>::vector
            ((vector<Rml::TexturedMesh,_std::allocator<Rml::TexturedMesh>_> *)local_58,sVar7,
             &local_59);
  ::std::allocator<Rml::TexturedMesh>::~allocator(&local_59);
  local_78 = (pointer)0x0;
  while( true ) {
    pCVar5 = local_78;
    pCVar8 = (pointer)::std::
                      vector<Rml::ElementText::TexturedGeometry,_std::allocator<Rml::ElementText::TexturedGeometry>_>
                      ::size(&this->geometry);
    if (pCVar8 <= pCVar5) break;
    pvVar9 = ::std::
             vector<Rml::ElementText::TexturedGeometry,_std::allocator<Rml::ElementText::TexturedGeometry>_>
             ::operator[](&this->geometry,(size_type)local_78);
    Geometry::Release((Mesh *)&i_1,&pvVar9->geometry,ClearMesh);
    pvVar10 = ::std::vector<Rml::TexturedMesh,_std::allocator<Rml::TexturedMesh>_>::operator[]
                        ((vector<Rml::TexturedMesh,_std::allocator<Rml::TexturedMesh>_> *)local_58,
                         (size_type)local_78);
    Mesh::operator=(&pvVar10->mesh,(Mesh *)&i_1);
    Mesh::~Mesh((Mesh *)&i_1);
    local_78 = (pointer)((long)&local_78->operation + 1);
  }
  local_b0 = 0;
  while( true ) {
    uVar4 = local_b0;
    sVar7 = ::std::vector<Rml::ElementText::Line,_std::allocator<Rml::ElementText::Line>_>::size
                      (&this->lines);
    if (sVar7 <= uVar4) break;
    pFVar11 = GetFontEngineInterface();
    FVar1 = this->font_effects_handle;
    pvVar12 = ::std::vector<Rml::ElementText::Line,_std::allocator<Rml::ElementText::Line>_>::
              operator[](&this->lines,local_b0);
    StringView::StringView(&local_c0,&pvVar12->text);
    pvVar12 = ::std::vector<Rml::ElementText::Line,_std::allocator<Rml::ElementText::Line>_>::
              operator[](&this->lines,local_b0);
    local_c8 = pvVar12->position;
    i_2._4_4_ = this->colour;
    iVar6 = (*pFVar11->_vptr_FontEngineInterface[10])
                      (local_c8,this->opacity,pFVar11,render_manager,font_face_handle,FVar1,
                       local_c0.p_begin,local_c0.p_end,i_2._4_4_,
                       &mesh_list.
                        super__Vector_base<Rml::TexturedMesh,_std::allocator<Rml::TexturedMesh>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage,local_58);
    pvVar12 = ::std::vector<Rml::ElementText::Line,_std::allocator<Rml::ElementText::Line>_>::
              operator[](&this->lines,local_b0);
    pvVar12->width = iVar6;
    local_b0 = local_b0 + 1;
  }
  sVar7 = ::std::vector<Rml::TexturedMesh,_std::allocator<Rml::TexturedMesh>_>::size
                    ((vector<Rml::TexturedMesh,_std::allocator<Rml::TexturedMesh>_> *)local_58);
  ::std::
  vector<Rml::ElementText::TexturedGeometry,_std::allocator<Rml::ElementText::TexturedGeometry>_>::
  resize(&this->geometry,sVar7);
  local_e8._16_8_ = (pointer)0x0;
  while( true ) {
    uVar3 = local_e8._16_8_;
    pGVar13 = (pointer)::std::
                       vector<Rml::ElementText::TexturedGeometry,_std::allocator<Rml::ElementText::TexturedGeometry>_>
                       ::size(&this->geometry);
    if (pGVar13 <= (ulong)uVar3) break;
    ::std::vector<Rml::TexturedMesh,_std::allocator<Rml::TexturedMesh>_>::operator[]
              ((vector<Rml::TexturedMesh,_std::allocator<Rml::TexturedMesh>_> *)local_58,
               local_e8._16_8_);
    RenderManager::MakeGeometry((RenderManager *)local_e8,(Mesh *)render_manager);
    pvVar9 = ::std::
             vector<Rml::ElementText::TexturedGeometry,_std::allocator<Rml::ElementText::TexturedGeometry>_>
             ::operator[](&this->geometry,local_e8._16_8_);
    Geometry::operator=(&pvVar9->geometry,(Geometry *)local_e8);
    Geometry::~Geometry((Geometry *)local_e8);
    pvVar10 = ::std::vector<Rml::TexturedMesh,_std::allocator<Rml::TexturedMesh>_>::operator[]
                        ((vector<Rml::TexturedMesh,_std::allocator<Rml::TexturedMesh>_> *)local_58,
                         local_e8._16_8_);
    pvVar9 = ::std::
             vector<Rml::ElementText::TexturedGeometry,_std::allocator<Rml::ElementText::TexturedGeometry>_>
             ::operator[](&this->geometry,local_e8._16_8_);
    (pvVar9->texture).render_manager = (pvVar10->texture).render_manager;
    SVar2 = (pvVar10->texture).callback_index;
    (pvVar9->texture).file_index = (pvVar10->texture).file_index;
    (pvVar9->texture).callback_index = SVar2;
    local_e8._16_8_ =
         (long)&(((Mesh *)local_e8._16_8_)->vertices).
                super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>._M_impl.
                super__Vector_impl_data._M_start + 1;
  }
  this->generated_decoration = None;
  this->field_0x1ec = this->field_0x1ec & 0xfe;
  ::std::vector<Rml::TexturedMesh,_std::allocator<Rml::TexturedMesh>_>::~vector
            ((vector<Rml::TexturedMesh,_std::allocator<Rml::TexturedMesh>_> *)local_58);
  return;
}

Assistant:

void ElementText::GenerateGeometry(RenderManager& render_manager, const FontFaceHandle font_face_handle)
{
	RMLUI_ZoneScopedC(0xD2691E);

	const auto& computed = GetComputedValues();
	const TextShapingContext text_shaping_context{computed.language(), computed.direction(), computed.letter_spacing()};

	// Release the old geometry, and reuse the mesh buffers.
	TexturedMeshList mesh_list(geometry.size());
	for (size_t i = 0; i < geometry.size(); i++)
		mesh_list[i].mesh = geometry[i].geometry.Release(Geometry::ReleaseMode::ClearMesh);

	// Generate the new geometry, one line at a time.
	for (size_t i = 0; i < lines.size(); ++i)
	{
		lines[i].width = GetFontEngineInterface()->GenerateString(render_manager, font_face_handle, font_effects_handle, lines[i].text,
			lines[i].position, colour, opacity, text_shaping_context, mesh_list);
	}

	// Apply the new geometry and textures.
	geometry.resize(mesh_list.size());
	for (size_t i = 0; i < geometry.size(); i++)
	{
		geometry[i].geometry = render_manager.MakeGeometry(std::move(mesh_list[i].mesh));
		geometry[i].texture = mesh_list[i].texture;
	}

	generated_decoration = Style::TextDecoration::None;
	geometry_dirty = false;
}